

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O3

void radio_save(t_gobj *z,_binbuf *b)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  t_symbol *ptVar11;
  t_symbol *ptVar12;
  t_symbol *ptVar13;
  undefined4 extraout_var;
  char *pcVar14;
  char *s;
  bool bVar15;
  double dVar16;
  t_symbol *srl [3];
  t_symbol *bflcol [3];
  
  bVar15 = *(int *)((long)&z[0x4a].g_next + 4) == 0;
  pcVar14 = "hdl";
  if (bVar15) {
    pcVar14 = "hradio";
  }
  s = "vdl";
  if (bVar15) {
    s = "vradio";
  }
  if (*(int *)&z[0x4a].g_next == 0) {
    s = pcVar14;
  }
  iemgui_save((t_iemgui *)z,srl,bflcol);
  ptVar11 = gensym("#X");
  ptVar12 = gensym("obj");
  sVar1 = *(short *)&z[2].g_next;
  sVar2 = *(short *)((long)&z[2].g_next + 2);
  ptVar13 = gensym(s);
  iVar3 = *(int *)((long)&z[4].g_pd + 4);
  iVar4 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  uVar5 = *(uint *)&z[0x49].g_next;
  iVar9 = iem_symargstoint((t_iem_init_symargs *)&z[0x44].g_next);
  uVar6 = *(uint *)((long)&z[0x49].g_next + 4);
  uVar7 = *(uint *)&z[5].g_pd;
  uVar8 = *(uint *)((long)&z[5].g_pd + 4);
  uVar10 = iem_fstyletoint((t_iem_fstyle_flags *)(z + 0x44));
  dVar16 = 0.0;
  if (((ulong)z[0x44].g_next & 1) != 0) {
    dVar16 = (double)*(float *)((long)&z[0x4a].g_pd + 4);
  }
  binbuf_addv(b,"ssiisiiiisssiiiisssf",dVar16,ptVar11,ptVar12,(ulong)(uint)(int)sVar1,
              (ulong)(uint)(int)sVar2,ptVar13,(long)iVar3 / (long)iVar4 & 0xffffffff,(ulong)uVar5,
              CONCAT44(extraout_var,iVar9),(ulong)uVar6,srl[0],srl[1],srl[2],(ulong)uVar7,
              (ulong)uVar8,(ulong)uVar10,(ulong)*(uint *)((long)&z[0x44].g_pd + 4),bflcol[0],
              bflcol[1],bflcol[2]);
  binbuf_addv(b,";");
  return;
}

Assistant:

static void radio_save(t_gobj *z, t_binbuf *b)
{
    t_radio *x = (t_radio *)z;
    t_symbol *bflcol[3];
    t_symbol *srl[3];

    const char*objname;
    if(x->x_orientation == horizontal)
    {
        if(x->x_compat)
            objname="hdl";
        else
            objname="hradio";
    } else {
        if(x->x_compat)
            objname="vdl";
        else
            objname="vradio";
    }

    iemgui_save(&x->x_gui, srl, bflcol);
    binbuf_addv(b, "ssiisiiiisssiiiisssf", gensym("#X"), gensym("obj"),
                (int)x->x_gui.x_obj.te_xpix,
                (int)x->x_gui.x_obj.te_ypix,
        gensym(objname),
                x->x_gui.x_w/IEMGUI_ZOOM(x),
                x->x_change, iem_symargstoint(&x->x_gui.x_isa), x->x_number,
                srl[0], srl[1], srl[2],
                x->x_gui.x_ldx, x->x_gui.x_ldy,
                iem_fstyletoint(&x->x_gui.x_fsf), x->x_gui.x_fontsize,
                bflcol[0], bflcol[1], bflcol[2],
                x->x_gui.x_isa.x_loadinit?x->x_fval:0.);
    binbuf_addv(b, ";");
}